

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> * __thiscall
SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
          (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
           *this,char bits)

{
  byte in_SIL;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *in_RDI;
  
  if ((char)in_SIL < '\0') {
    __assert_fail("!std::numeric_limits< U >::is_signed || bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x1781,
                  "SafeInt<T, E> &SafeInt<int>::operator<<=(U) [T = int, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = char]"
                 );
  }
  if ((char)in_SIL < ' ') {
    in_RDI->m_int = in_RDI->m_int << (in_SIL & 0x1f);
    return in_RDI;
  }
  __assert_fail("bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x1782,
                "SafeInt<T, E> &SafeInt<int>::operator<<=(U) [T = int, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = char]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator <<=( U bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || bits >= 0 );
        ShiftAssert( bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int <<= bits;
        return *this;
    }